

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-alloc-cb-fail.c
# Opt level: O0

void cl_recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *buf,sockaddr *addr,uint flags)

{
  int iVar1;
  int64_t eval_b_4;
  int64_t eval_a_4;
  void *eval_b_3;
  void *eval_a_3;
  void *eval_b_2;
  void *eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uint flags_local;
  sockaddr *addr_local;
  uv_buf_t *buf_local;
  ssize_t nread_local;
  uv_udp_t *handle_local;
  
  if (handle != &server && handle != &client) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0x43,"(uv_udp_t*)(handle) == &server || (uv_udp_t*)(handle) == &client","!=","0",0,"!="
            ,0);
    abort();
  }
  if ((ulong)flags != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0x44,"flags","==","0",(ulong)flags,"==",0);
    abort();
  }
  if (nread < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0x47,"0 && \"unexpected error\"");
    abort();
  }
  if (nread == 0) {
    if (addr != (sockaddr *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
              ,0x4c,"addr","==","NULL",addr,"==",0);
      abort();
    }
  }
  else {
    if (addr == (sockaddr *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
              ,0x50,"addr","!=","NULL",0,"!=",0);
      abort();
    }
    if (nread != 4) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
              ,0x51,"4","==","nread",4,"==",nread);
      abort();
    }
    iVar1 = memcmp("PONG",buf->base,4);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
              ,0x52,"!memcmp(\"PONG\", buf->base, nread)");
      abort();
    }
    cl_recv_cb_called = cl_recv_cb_called + 1;
    uv_close(handle,close_cb);
  }
  return;
}

Assistant:

static void cl_recv_cb(uv_udp_t* handle,
                       ssize_t nread,
                       const uv_buf_t* buf,
                       const struct sockaddr* addr,
                       unsigned flags) {
  CHECK_HANDLE(handle);
  ASSERT_OK(flags);
  ASSERT_EQ(nread, UV_ENOBUFS);

  cl_recv_cb_called++;

  uv_close((uv_handle_t*) handle, close_cb);
}